

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMerge.c
# Opt level: O0

void Abc_NtkMarkFanouts_rec(Abc_Obj_t *pLut,int nLevMax,int nFanMax)

{
  int iVar1;
  Abc_Obj_t *pLut_00;
  int local_24;
  int i;
  Abc_Obj_t *pNext;
  int nFanMax_local;
  int nLevMax_local;
  Abc_Obj_t *pLut_local;
  
  iVar1 = Abc_ObjIsNode(pLut);
  if ((iVar1 != 0) && (iVar1 = Abc_NodeIsTravIdCurrent(pLut), iVar1 == 0)) {
    Abc_NodeSetTravIdCurrent(pLut);
    iVar1 = Abc_ObjLevel(pLut);
    if ((iVar1 <= nLevMax) && (iVar1 = Abc_ObjFanoutNum(pLut), iVar1 <= nFanMax)) {
      for (local_24 = 0; iVar1 = Abc_ObjFanoutNum(pLut), local_24 < iVar1; local_24 = local_24 + 1)
      {
        pLut_00 = Abc_ObjFanout(pLut,local_24);
        Abc_NtkMarkFanouts_rec(pLut_00,nLevMax,nFanMax);
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkMarkFanouts_rec( Abc_Obj_t * pLut, int nLevMax, int nFanMax )
{
    Abc_Obj_t * pNext;
    int i;
    if ( !Abc_ObjIsNode(pLut) )
        return;
    if ( Abc_NodeIsTravIdCurrent( pLut ) )
        return;
    Abc_NodeSetTravIdCurrent( pLut );
    if ( Abc_ObjLevel(pLut) > nLevMax )
        return;
    if ( Abc_ObjFanoutNum(pLut) > nFanMax )
        return;
    Abc_ObjForEachFanout( pLut, pNext, i )
        Abc_NtkMarkFanouts_rec( pNext, nLevMax, nFanMax );
}